

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

size_t __thiscall
httplib::detail::MultipartFormDataParser::find_string
          (MultipartFormDataParser *this,string *s,string *pattern)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  size_type rem;
  size_type pos;
  size_t off;
  value_type c;
  string *pattern_local;
  string *s_local;
  MultipartFormDataParser *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::front();
  cVar1 = *pcVar3;
  pos = 0;
  while( true ) {
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= pos) {
      sVar5 = std::__cxx11::string::size();
      return sVar5;
    }
    sVar5 = std::__cxx11::string::find((char)s,(ulong)(uint)(int)cVar1);
    if (sVar5 == 0xffffffffffffffff) {
      sVar5 = std::__cxx11::string::size();
      return sVar5;
    }
    lVar6 = std::__cxx11::string::size();
    uVar4 = std::__cxx11::string::size();
    if (lVar6 - sVar5 < uVar4) {
      return sVar5;
    }
    bVar2 = start_with(this,s,sVar5,pattern);
    if (bVar2) break;
    pos = sVar5 + 1;
  }
  return sVar5;
}

Assistant:

size_t find_string(const std::string &s, const std::string &pattern) const {
				auto c = pattern.front();

				size_t off = 0;
				while (off < s.size()) {
					auto pos = s.find(c, off);
					if (pos == std::string::npos) { return s.size(); }

					auto rem = s.size() - pos;
					if (pattern.size() > rem) { return pos; }

					if (start_with(s, pos, pattern)) { return pos; }

					off = pos + 1;
				}

				return s.size();
			}